

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void SstWriterDefinitionLock(SstStream Stream,long EffectiveTimestep)

{
  SstStream in_RSI;
  SstStream in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar1;
  
  pthread_mutex_lock((pthread_mutex_t *)&in_RDI->DataLock);
  in_RDI->WriterDefinitionsLocked = 1;
  if (in_RDI->Rank == 0) {
    for (iVar1 = 0; iVar1 < in_RDI->ReaderCount; iVar1 = iVar1 + 1) {
      UpdateLockDefnsList(in_RSI,(WS_ReaderInfo)CONCAT44(iVar1,in_stack_ffffffffffffffe8),0x11b3d9);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&in_RDI->DataLock);
  CP_verbose(in_RDI,PerStepVerbose,"Writer-side definitions lock as of timestep %ld\n",in_RSI);
  return;
}

Assistant:

extern void SstWriterDefinitionLock(SstStream Stream, long EffectiveTimestep)
{
    STREAM_MUTEX_LOCK(Stream);
    Stream->WriterDefinitionsLocked = 1;
    if (Stream->Rank == 0)
    {
        for (int i = 0; i < Stream->ReaderCount; i++)
        {
            UpdateLockDefnsList(Stream, Stream->Readers[i], EffectiveTimestep);
        }
    }
    STREAM_MUTEX_UNLOCK(Stream);
    CP_verbose(Stream, PerStepVerbose, "Writer-side definitions lock as of timestep %ld\n",
               EffectiveTimestep);
}